

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O2

bool __thiscall LSMTree::del(LSMTree *this,longlong key)

{
  size_t sVar1;
  MemTable *this_00;
  string local_40;
  
  get_abi_cxx11_(&local_40,this,key);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_40._M_string_length != 0) {
    (*(this->memory->
      super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      )._vptr_Dictionary[3])(this->memory,key);
    sVar1 = MemTable::size_bytes(this->memory);
    if ((ulong)(long)this->MEMTABLE_LIMIT < sVar1) {
      DiskTable::persistent(this->disk,this->memory,true);
      this_00 = (MemTable *)operator_new(0x30);
      MemTable::MemTable(this_00);
      this->memory = this_00;
    }
  }
  return local_40._M_string_length != 0;
}

Assistant:

bool LSMTree::del(long long key) {
    if (get(key).empty()) {
        return false;
    }
    memory->remove(key);
    if (memory->size_bytes() > MEMTABLE_LIMIT) {
        disk->persistent(std::move(*memory), true);
        memory = new MemTable{};
    }
    return true;
}